

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_buffer_block(CompilerCPP *this,SPIRVariable *var)

{
  undefined8 uVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  char (*in_stack_ffffffffffffff10) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string buffer_name;
  uint32_t binding;
  uint32_t local_44;
  undefined1 local_40 [4];
  uint32_t descriptor_set;
  string instance_name;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  instance_name.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_40,this,(ulong)uVar2,1);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_44 = (pmVar3->decoration).set;
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  buffer_name.field_2._8_4_ = (pmVar3->decoration).binding;
  emit_block_struct(this,(SPIRType *)instance_name.field_2._8_8_);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(instance_name.field_2._8_8_ + 8));
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_78,this,(ulong)uVar2,1);
  uVar1 = instance_name.field_2._8_8_;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&local_98,this,uVar1,(ulong)uVar2);
  CompilerGLSL::
  statement<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [20])"internal::Resource<",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,&local_98
             ,(char (*) [3])0x681592,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [4])"__;");
  ::std::__cxx11::string::~string((string *)&local_98);
  CompilerGLSL::
  statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
            (&this->super_CompilerGLSL,(char (*) [9])"#define ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [9])" __res->",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [9])"__.get()");
  join<char_const(&)[21],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
            (&local_b8,(spirv_cross *)"s.register_resource(",(char (*) [21])local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x669987,
             (char (*) [3])0x6737c9,(char (*) [3])&local_44,(uint *)0x6737c9,
             (char (*) [3])((long)&buffer_name.field_2 + 8),(uint *)0x6815da,
             in_stack_ffffffffffffff10);
  t = &local_b8;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(&this->resource_registrations,t);
  ::std::__cxx11::string::~string((string *)t);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
  ::std::__cxx11::string::~string((string *)local_78);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CompilerCPP::emit_buffer_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto instance_name = to_name(var.self);

	uint32_t descriptor_set = ir.meta[var.self].decoration.set;
	uint32_t binding = ir.meta[var.self].decoration.binding;

	emit_block_struct(type);
	auto buffer_name = to_name(type.self);

	statement("internal::Resource<", buffer_name, type_to_array_glsl(type, var.self), "> ", instance_name, "__;");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
	resource_registrations.push_back(
	    join("s.register_resource(", instance_name, "__", ", ", descriptor_set, ", ", binding, ");"));
	statement("");
}